

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_belief.cpp
# Opt level: O0

vector<despot::State_*,_std::allocator<despot::State_*>_> *
despot::ParticleBelief::Resample
          (vector<despot::State_*,_std::allocator<despot::State_*>_> *__return_storage_ptr__,int num
          ,Belief *belief,History *history,int hstart)

{
  long *plVar1;
  bool bVar2;
  ACT_TYPE AVar3;
  int iVar4;
  ulong uVar5;
  size_t sVar6;
  OBS_TYPE OVar7;
  double *pdVar8;
  size_type sVar9;
  reference ppSVar10;
  log_ostream *plVar11;
  ostream *poVar12;
  double dVar13;
  double dVar14;
  int local_104;
  int local_100;
  int i_5;
  int i_4;
  int i_3;
  double total_weight;
  int i_2;
  __normal_iterator<despot::State_**,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>
  local_e0;
  __normal_iterator<despot::State_**,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>
  local_d8;
  const_iterator local_d0;
  int local_c4;
  double dStack_c0;
  int i_1;
  double prob;
  double dStack_b0;
  int i;
  double log_wgt;
  State *particle;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_90;
  int local_74;
  undefined1 local_70 [4];
  int trial;
  vector<despot::State_*,_std::allocator<despot::State_*>_> particles;
  double max_wgt;
  int local_48;
  int pos;
  int count;
  OBS_TYPE obs;
  double reward;
  History *pHStack_28;
  int hstart_local;
  History *history_local;
  Belief *belief_local;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *pvStack_10;
  int num_local;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *sample;
  
  reward._4_4_ = hstart;
  pHStack_28 = history;
  history_local = (History *)belief;
  belief_local._4_4_ = num;
  pvStack_10 = __return_storage_ptr__;
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector(__return_storage_ptr__);
  local_48 = 0;
  max_wgt._4_4_ = 0;
  particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0xfff0000000000000;
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
            ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_70);
  local_74 = 0;
  do {
    bVar2 = true;
    if (belief_local._4_4_ <= local_48) {
      bVar2 = SBORROW4(local_74,belief_local._4_4_ * 200) !=
              local_74 + belief_local._4_4_ * -200 < 0;
    }
    if (!bVar2) {
      for (total_weight._4_4_ = max_wgt._4_4_;
          sVar9 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                            ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_70),
          (ulong)(long)total_weight._4_4_ < sVar9; total_weight._4_4_ = total_weight._4_4_ + 1) {
        plVar1 = (long *)(history_local->actions_).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
        ppSVar10 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                             ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_70,
                              (long)total_weight._4_4_);
        (**(code **)(*plVar1 + 0xb8))(plVar1,*ppSVar10);
      }
      _i_4 = 0.0;
      for (i_5 = 0; sVar9 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                                      (__return_storage_ptr__), (ulong)(long)i_5 < sVar9;
          i_5 = i_5 + 1) {
        ppSVar10 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                             (__return_storage_ptr__,(long)i_5);
        dVar14 = exp((*ppSVar10)->weight -
                     (double)particles.
                             super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
        ppSVar10 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                             (__return_storage_ptr__,(long)i_5);
        (*ppSVar10)->weight = dVar14;
        ppSVar10 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                             (__return_storage_ptr__,(long)i_5);
        _i_4 = (*ppSVar10)->weight + _i_4;
      }
      for (local_100 = 0;
          sVar9 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                            (__return_storage_ptr__), (ulong)(long)local_100 < sVar9;
          local_100 = local_100 + 1) {
        ppSVar10 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                             (__return_storage_ptr__,(long)local_100);
        dVar14 = (*ppSVar10)->weight;
        ppSVar10 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                             (__return_storage_ptr__,(long)local_100);
        (*ppSVar10)->weight = dVar14 / _i_4;
      }
      iVar4 = logging::level();
      if ((0 < iVar4) && (iVar4 = logging::level(), 3 < iVar4)) {
        plVar11 = logging::stream(4);
        poVar12 = std::operator<<(&plVar11->super_ostream,"[Belief::Resample] Resampled ");
        sVar9 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                          (__return_storage_ptr__);
        poVar12 = (ostream *)std::ostream::operator<<(poVar12,sVar9);
        poVar12 = std::operator<<(poVar12," particles");
        std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
      }
      for (local_104 = 0;
          sVar9 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                            (__return_storage_ptr__), (ulong)(long)local_104 < sVar9;
          local_104 = local_104 + 1) {
        iVar4 = logging::level();
        if ((0 < iVar4) && (iVar4 = logging::level(), 4 < iVar4)) {
          plVar11 = logging::stream(5);
          poVar12 = std::operator<<(&plVar11->super_ostream," ");
          poVar12 = (ostream *)std::ostream::operator<<(poVar12,local_104);
          poVar12 = std::operator<<(poVar12," = ");
          ppSVar10 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                               (__return_storage_ptr__,(long)local_104);
          poVar12 = despot::operator<<(poVar12,*ppSVar10);
          std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
        }
      }
      std::vector<despot::State_*,_std::allocator<despot::State_*>_>::~vector
                ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_70);
      return __return_storage_ptr__;
    }
    sVar9 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                      ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_70);
    if ((long)max_wgt._4_4_ == sVar9) {
      (**(code **)((history_local->actions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + 4))
                (&local_90,history_local,belief_local._4_4_);
      std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator=
                ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_70,&local_90);
      std::vector<despot::State_*,_std::allocator<despot::State_*>_>::~vector(&local_90);
      max_wgt._4_4_ = 0;
    }
    ppSVar10 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                         ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_70,
                          (long)max_wgt._4_4_);
    log_wgt = (double)*ppSVar10;
    local_74 = local_74 + 1;
    dStack_b0 = 0.0;
    for (prob._4_4_ = reward._4_4_; uVar5 = (ulong)prob._4_4_, sVar6 = History::Size(history),
        dVar14 = log_wgt, uVar5 < sVar6; prob._4_4_ = prob._4_4_ + 1) {
      plVar1 = (long *)(history_local->actions_).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
      dVar13 = Random::NextDouble((Random *)&Random::RANDOM);
      AVar3 = History::Action(history,prob._4_4_);
      (**(code **)(*plVar1 + 0x10))(dVar13,plVar1,dVar14,AVar3,&obs,&count);
      plVar1 = (long *)(history_local->actions_).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
      OVar7 = History::Observation(history,prob._4_4_);
      dVar14 = log_wgt;
      AVar3 = History::Action(history,prob._4_4_);
      dStack_c0 = (double)(**(code **)(*plVar1 + 0x38))(plVar1,OVar7,dVar14,AVar3);
      if (dStack_c0 <= 0.0) {
        plVar1 = (long *)(history_local->actions_).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
        (**(code **)(*plVar1 + 0xb8))(plVar1,log_wgt);
        break;
      }
      dVar14 = log(dStack_c0);
      dStack_b0 = dVar14 + dStack_b0;
    }
    bVar2 = MemoryObject::IsAllocated((MemoryObject *)((long)log_wgt + 8));
    if (bVar2) {
      *(double *)((long)log_wgt + 0x18) = dStack_b0;
      std::vector<despot::State_*,_std::allocator<despot::State_*>_>::push_back
                (__return_storage_ptr__,(value_type *)&log_wgt);
      pdVar8 = std::max<double>(&stack0xffffffffffffff50,
                                (double *)
                                &particles.
                                 super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)*pdVar8;
      local_48 = local_48 + 1;
    }
    if (local_48 == belief_local._4_4_) {
      sVar9 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                        (__return_storage_ptr__);
      local_c4 = (int)sVar9;
      while (local_c4 = local_c4 + -1, -1 < local_c4) {
        ppSVar10 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                             (__return_storage_ptr__,(long)local_c4);
        dVar14 = (*ppSVar10)->weight -
                 (double)particles.
                         super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
        dVar13 = log(1.0 / (double)belief_local._4_4_);
        if (dVar14 < dVar13) {
          plVar1 = (long *)(history_local->actions_).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_finish;
          ppSVar10 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                               (__return_storage_ptr__,(long)local_c4);
          (**(code **)(*plVar1 + 0xb8))(plVar1,*ppSVar10);
          local_e0._M_current =
               (State **)
               std::vector<despot::State_*,_std::allocator<despot::State_*>_>::begin
                         (__return_storage_ptr__);
          local_d8 = __gnu_cxx::
                     __normal_iterator<despot::State_**,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>
                     ::operator+(&local_e0,(long)local_c4);
          __gnu_cxx::
          __normal_iterator<despot::State*const*,std::vector<despot::State*,std::allocator<despot::State*>>>
          ::__normal_iterator<despot::State**>
                    ((__normal_iterator<despot::State*const*,std::vector<despot::State*,std::allocator<despot::State*>>>
                      *)&local_d0,&local_d8);
          std::vector<despot::State_*,_std::allocator<despot::State_*>_>::erase
                    (__return_storage_ptr__,local_d0);
          local_48 = local_48 + -1;
        }
      }
    }
    max_wgt._4_4_ = max_wgt._4_4_ + 1;
  } while( true );
}

Assistant:

vector<State*> ParticleBelief::Resample(int num, const Belief& belief, History history,
	int hstart) {
	double reward;
	OBS_TYPE obs;

	vector<State*> sample;
	int count = 0;
	int pos = 0;
	double max_wgt = Globals::NEG_INFTY;
	vector<State*> particles;
	int trial = 0;
	while (count < num || trial < 200 * num) {
		// Pick next particle
		if (pos == particles.size()) {
			particles = belief.Sample(num);
			pos = 0;
		}
		State* particle = particles[pos];

		trial++;

		// Step through history
		double log_wgt = 0;
		for (int i = hstart; i < history.Size(); i++) {
			belief.model_->Step(*particle, Random::RANDOM.NextDouble(),
				history.Action(i), reward, obs);

			double prob = belief.model_->ObsProb(history.Observation(i),
				*particle, history.Action(i));
			if (prob > 0) {
				log_wgt += log(prob);
			} else {
				belief.model_->Free(particle);
				break;
			}
		}

		// Add to sample if survived
		if (particle->IsAllocated()) {
			particle->weight = log_wgt;
			sample.push_back(particle);

			max_wgt = max(log_wgt, max_wgt);
			count++;
		}

		// Remove particles with very small weights
		if (count == num) {
			for (int i = sample.size() - 1; i >= 0; i--) {
				if (sample[i]->weight - max_wgt < log(1.0 / num)) {
					belief.model_->Free(sample[i]);
					sample.erase(sample.begin() + i);
					count--;
				}
			}
		}

		pos++;
	}

	// Free unused particles
	for (int i = pos; i < particles.size(); i++)
		belief.model_->Free(particles[i]);

	double total_weight = 0;
	for (int i = 0; i < sample.size(); i++) {
		sample[i]->weight = exp(sample[i]->weight - max_wgt);
		total_weight += sample[i]->weight;
	}
	for (int i = 0; i < sample.size(); i++) {
		sample[i]->weight = sample[i]->weight / total_weight;
	}

	logd << "[Belief::Resample] Resampled " << sample.size() << " particles"
		<< endl;
	for (int i = 0; i < sample.size(); i++) {
		logv << " " << i << " = " << *sample[i] << endl;
	}

	return sample;
}